

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvastexture.cpp
# Opt level: O1

void __thiscall FCanvasTexture::MakeTexture(FCanvasTexture *this)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  DSimpleCanvas *this_00;
  BYTE *__s;
  ulong __n;
  uint uVar4;
  
  this_00 = (DSimpleCanvas *)
            M_Malloc_Dbg(0x50,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                         ,0x1f7);
  DSimpleCanvas::DSimpleCanvas
            (this_00,(uint)(this->super_FTexture).Width,(uint)(this->super_FTexture).Height);
  this->Canvas = this_00;
  (*(this_00->super_DCanvas).super_DObject._vptr_DObject[8])(this_00);
  GC::AddSoftRoot((DObject *)this->Canvas);
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  uVar4 = (uint)uVar1;
  if ((uVar1 == uVar2) && ((this->Canvas->super_DCanvas).Pitch == uVar4)) {
    __s = (this->Canvas->super_DCanvas).Buffer;
    bVar3 = false;
  }
  else {
    __s = (BYTE *)operator_new__((ulong)uVar4 * (ulong)uVar2);
    bVar3 = true;
  }
  this->Pixels = __s;
  this->bPixelsAllocated = bVar3;
  memset(__s,0,(ulong)(uVar2 * uVar4 >> 1));
  __n = (ulong)((uint)(this->super_FTexture).Height * (uint)(this->super_FTexture).Width >> 1);
  memset(this->Pixels + __n,0xff,__n);
  return;
}

Assistant:

void FCanvasTexture::MakeTexture ()
{
	Canvas = new DSimpleCanvas (Width, Height);
	Canvas->Lock ();
	GC::AddSoftRoot(Canvas);
	if (Width != Height || Width != Canvas->GetPitch())
	{
		Pixels = new BYTE[Width*Height];
		bPixelsAllocated = true;
	}
	else
	{
		Pixels = Canvas->GetBuffer();
		bPixelsAllocated = false;
	}
	// Draw a special "unrendered" initial texture into the buffer.
	memset (Pixels, 0, Width*Height/2);
	memset (Pixels+Width*Height/2, 255, Width*Height/2);
}